

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O3

void __thiscall
Js::
CopyRemovePolicy<JsUtil::List<Lifetime_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
::RemoveAt(CopyRemovePolicy<JsUtil::List<Lifetime_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
           *this,List<Lifetime_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 *list,int index)

{
  Type ppLVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  long lVar6;
  
  if ((index < 0) ||
     (iVar4 = (list->super_ReadOnlyList<Lifetime_*,_Memory::JitArenaAllocator,_DefaultComparer>).
              count, iVar4 <= index)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/List.h"
                                ,0x2ee,"(index >= 0 && index < list->count)",
                                "index >= 0 && index < list->count");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
    iVar4 = (list->super_ReadOnlyList<Lifetime_*,_Memory::JitArenaAllocator,_DefaultComparer>).count
    ;
  }
  if (index + 1 < iVar4) {
    lVar6 = (long)(index + 1);
    do {
      ppLVar1 = (list->super_ReadOnlyList<Lifetime_*,_Memory::JitArenaAllocator,_DefaultComparer>).
                buffer;
      ppLVar1[index] = ppLVar1[lVar6];
      index = index + 1;
      lVar6 = lVar6 + 1;
    } while (iVar4 + -1 != index);
  }
  (list->super_ReadOnlyList<Lifetime_*,_Memory::JitArenaAllocator,_DefaultComparer>).count =
       iVar4 + -1;
  (list->super_ReadOnlyList<Lifetime_*,_Memory::JitArenaAllocator,_DefaultComparer>).buffer
  [iVar4 + -1] = (Lifetime *)0x0;
  return;
}

Assistant:

void RemoveAt(TListType* list, int index)
        {
            Assert(index >= 0 && index < list->count);
            for (int j = index + 1; j < list->count; index++, j++)
            {
                list->buffer[index] = list->buffer[j];
            }
            list->count--;

            if (clearOldEntries)
            {
                ClearArray(list->buffer + list->count, 1);
            }
        }